

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

double zeta(double p)

{
  double dVar1;
  double value_old;
  double value;
  int n;
  double p_local;
  
  if (p <= 1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"ZETA - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Exponent P <= 1.0.\n");
    exit(1);
  }
  value_old = 0.0;
  value._4_4_ = 0;
  do {
    value._4_4_ = value._4_4_ + 1;
    dVar1 = pow((double)value._4_4_,p);
    dVar1 = value_old + 1.0 / dVar1;
    if (dVar1 <= value_old) {
      return dVar1;
    }
    value_old = dVar1;
  } while (value._4_4_ < 1000);
  return dVar1;
}

Assistant:

BURKHARDT_EXPORT
double zeta ( double p )

//****************************************************************************80
//
//  Purpose:
//
//    ZETA estimates the Riemann Zeta function.
//
//  Definition:
//
//    For 1 < P, the Riemann Zeta function is defined as:
//
//      ZETA ( P ) = Sum ( 1 <= N < +oo ) 1 / N^P
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    25 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996.
//
//  Parameters:
//
//    Input, double P, the power to which the integers are raised.
//    P must be greater than 1.  
//
//    Output, double ZETA, an approximation to the Riemann
//    Zeta function.
//
{
  int n;
  double value;
  double value_old;

  if ( p <= 1.0 )
  {
    std::cerr << "\n";
    std::cerr << "ZETA - Fatal error!\n";
    std::cerr << "  Exponent P <= 1.0.\n";
    exit ( 1 );
  }

  value = 0.0;
  n = 0;

  for ( ; ; )
  {
    n = n + 1;
    value_old = value;
    value = value + 1.0 / pow ( double(n), p );

    if ( value <= value_old || 1000 <= n )
    {
      break;
    }

  }

  return value;
}